

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O2

void __thiscall
DeckBuilder::deckShuffler(DeckBuilder *this,list<BlackCard_*,_std::allocator<BlackCard_*>_> *black)

{
  pointer __x;
  _List_node_base *p_Var1;
  vector<BlackCard_*,_std::allocator<BlackCard_*>_> vect;
  _Vector_base<BlackCard_*,_std::allocator<BlackCard_*>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (BlackCard **)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (BlackCard **)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (_List_node_base *)black;
  while (p_Var1 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)black
        ) {
    std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>::push_back
              ((vector<BlackCard_*,_std::allocator<BlackCard_*>_> *)&local_38,
               (value_type *)(p_Var1 + 1));
  }
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<BlackCard**,std::vector<BlackCard*,std::allocator<BlackCard*>>>>
            ((__normal_iterator<BlackCard_**,_std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>_>
              )local_38._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<BlackCard_**,_std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>_>
              )local_38._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::clear(black);
  for (__x = local_38._M_impl.super__Vector_impl_data._M_start;
      __x != local_38._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::push_back(black,__x);
  }
  std::_Vector_base<BlackCard_*,_std::allocator<BlackCard_*>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void DeckBuilder::deckShuffler(list<BlackCard *> *black)
{
	vector<BlackCard *> vect;
	list<BlackCard *>::iterator it;
	for (it = black->begin(); it != black->end(); it++)
		vect.push_back((*it));

	random_shuffle(vect.begin(), vect.end());

	black->clear();

	vector<BlackCard *>::iterator it2;
	for (it2 = vect.begin(); it2 != vect.end(); it2++)
		black->push_back((*it2));
}